

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  uint uVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  uint uVar8;
  byte *pbVar9;
  char *pcVar10;
  stbi_uc *psVar11;
  int i;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int sizes [16];
  uint local_78 [18];
  int iVar7;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      iVar6 = stbi__get16be(z->s);
      iVar6 = iVar6 + -2;
      do {
        if (iVar6 < 1) goto LAB_00306cdb;
        psVar2 = z->s;
        pbVar9 = psVar2->img_buffer;
        if (pbVar9 < psVar2->img_buffer_end) {
LAB_00306aad:
          psVar2->img_buffer = pbVar9 + 1;
          bVar4 = *pbVar9;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar9 = psVar2->img_buffer;
            goto LAB_00306aad;
          }
          bVar4 = 0;
        }
        bVar15 = bVar4 & 0xf;
        if (bVar15 < 4 && bVar4 < 0x20) {
          lVar16 = 0;
          uVar8 = 0;
          do {
            psVar2 = z->s;
            pbVar9 = psVar2->img_buffer;
            if (pbVar9 < psVar2->img_buffer_end) {
LAB_00306b18:
              psVar2->img_buffer = pbVar9 + 1;
              uVar12 = (uint)*pbVar9;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
                goto LAB_00306b18;
              }
              uVar12 = 0;
            }
            local_78[lVar16] = uVar12;
            uVar8 = uVar8 + uVar12;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          iVar6 = iVar6 + -0x11;
          if (bVar4 < 0x10) {
            iVar7 = stbi__build_huffman(z->huff_dc + bVar15,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar7 = stbi__build_huffman(z->huff_ac + bVar15,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar7 == 0) goto LAB_00306bf8;
          if (uVar8 != 0) {
            uVar17 = 0;
            do {
              psVar2 = z->s;
              psVar11 = psVar2->img_buffer;
              if (psVar11 < psVar2->img_buffer_end) {
LAB_00306bd8:
                psVar2->img_buffer = psVar11 + 1;
                sVar3 = *psVar11;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar11 = psVar2->img_buffer;
                  goto LAB_00306bd8;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar15].values[uVar17 + lVar16 + -8] = sVar3;
              uVar17 = uVar17 + 1;
            } while (uVar8 != uVar17);
          }
          if (0xf < bVar4) {
            lVar16 = 0;
            do {
              uVar17 = (ulong)z->huff_ac[bVar15].fast[lVar16];
              z->fast_ac[bVar15][lVar16] = 0;
              if (uVar17 != 0xff) {
                bVar4 = z->huff_ac[bVar15].values[uVar17];
                uVar12 = bVar4 & 0xf;
                if ((bVar4 & 0xf) != 0) {
                  uVar13 = (uint)z->huff_ac[bVar15].size[uVar17];
                  uVar1 = uVar12 + uVar13;
                  if (uVar1 < 10) {
                    uVar14 = (int)lVar16 << (uVar13 & 0x1f) & 0x1ff;
                    uVar13 = -1 << uVar12 | 1;
                    if (0xff < uVar14) {
                      uVar13 = 0;
                    }
                    iVar7 = uVar13 + (uVar14 >> ((byte)(9 - (char)uVar12) & 0x1f));
                    if ((char)iVar7 == iVar7) {
                      z->fast_ac[bVar15][lVar16] =
                           (short)iVar7 * 0x100 | bVar4 & 0xfff0 | (ushort)uVar1;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x200);
          }
          iVar6 = iVar6 - uVar8;
          bVar18 = true;
        }
        else {
          *(char **)(in_FS_OFFSET + -0x408) = "bad DHT header";
LAB_00306bf8:
          bVar18 = false;
        }
      } while (bVar18);
    }
    else {
      if (m != 0xdb) {
LAB_003069fd:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar8 = stbi__get16be(z->s);
          if (1 < uVar8) {
            if (uVar8 < 7 || m != 0xe0) {
              if (uVar8 < 0xe || m != 0xee) {
                iVar6 = uVar8 - 2;
              }
              else {
                bVar18 = true;
                lVar16 = 0;
                do {
                  psVar2 = z->s;
                  psVar11 = psVar2->img_buffer;
                  if (psVar11 < psVar2->img_buffer_end) {
LAB_00306e07:
                    psVar2->img_buffer = psVar11 + 1;
                    sVar3 = *psVar11;
                  }
                  else {
                    if (psVar2->read_from_callbacks != 0) {
                      stbi__refill_buffer(psVar2);
                      psVar11 = psVar2->img_buffer;
                      goto LAB_00306e07;
                    }
                    sVar3 = '\0';
                  }
                  if (sVar3 != "Adobe"[lVar16]) {
                    bVar18 = false;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 6);
                if (bVar18) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar4 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar4;
                  iVar6 = uVar8 - 0xe;
                }
                else {
                  iVar6 = uVar8 - 8;
                }
              }
            }
            else {
              bVar18 = true;
              lVar16 = 0;
              do {
                psVar2 = z->s;
                psVar11 = psVar2->img_buffer;
                if (psVar11 < psVar2->img_buffer_end) {
LAB_00306d81:
                  psVar2->img_buffer = psVar11 + 1;
                  sVar3 = *psVar11;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar2);
                    psVar11 = psVar2->img_buffer;
                    goto LAB_00306d81;
                  }
                  sVar3 = '\0';
                }
                if (sVar3 != "JFIF"[lVar16]) {
                  bVar18 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 5);
              iVar6 = uVar8 - 7;
              if (bVar18) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar6);
            goto LAB_00306e8c;
          }
          if (m == 0xfe) {
            pcVar10 = "bad COM len";
          }
          else {
            pcVar10 = "bad APP len";
          }
        }
        else {
          pcVar10 = "unknown marker";
        }
        goto LAB_00306d10;
      }
      iVar6 = stbi__get16be(z->s);
      iVar6 = iVar6 + -2;
      do {
        if (iVar6 < 1) goto LAB_00306cdb;
        psVar2 = z->s;
        pbVar9 = psVar2->img_buffer;
        if (pbVar9 < psVar2->img_buffer_end) {
LAB_003068e2:
          psVar2->img_buffer = pbVar9 + 1;
          bVar4 = *pbVar9;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar9 = psVar2->img_buffer;
            goto LAB_003068e2;
          }
          bVar4 = 0;
        }
        if ((bVar4 & 0xf0) == 0x10 || bVar4 < 0x10) {
          if (3 < (bVar4 & 0xf)) {
            *(char **)(in_FS_OFFSET + -0x408) = "bad DQT table";
            goto LAB_0030692b;
          }
          lVar16 = 0;
          do {
            psVar2 = z->s;
            if (bVar4 < 0x10) {
              pbVar9 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar9) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar5 = 0;
                  goto LAB_0030698c;
                }
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar9 + 1;
              uVar5 = (ushort)*pbVar9;
            }
            else {
              iVar7 = stbi__get16be(psVar2);
              uVar5 = (ushort)iVar7;
            }
LAB_0030698c:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar16] * 2 + (ulong)((bVar4 & 0xf) << 7)) =
                 uVar5;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar6 = (uint)(bVar4 < 0x10) * 0x40 + -0x81 + iVar6;
          bVar18 = true;
        }
        else {
          *(char **)(in_FS_OFFSET + -0x408) = "bad DQT type";
LAB_0030692b:
          bVar18 = false;
        }
      } while (bVar18);
    }
  }
  else {
    if (m == 0xdd) {
      iVar6 = stbi__get16be(z->s);
      if (iVar6 == 4) {
        iVar6 = stbi__get16be(z->s);
        z->restart_interval = iVar6;
LAB_00306e8c:
        bVar18 = true;
        goto LAB_00306d1b;
      }
      pcVar10 = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_003069fd;
      pcVar10 = "expected marker";
    }
LAB_00306d10:
    *(char **)(in_FS_OFFSET + -0x408) = pcVar10;
  }
  bVar18 = false;
LAB_00306d1b:
  return (int)bVar18;
LAB_00306cdb:
  bVar18 = iVar6 == 0;
  goto LAB_00306d1b;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}